

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QObject ** __thiscall
QHash<QObject_*,_QString>::keyImpl(QHash<QObject_*,_QString> *this,QString *value)

{
  long lVar1;
  bool bVar2;
  const_iterator *in_RSI;
  const_iterator *in_RDI;
  long in_FS_OFFSET;
  const_iterator i;
  QString *in_stack_ffffffffffffffa8;
  QString *in_stack_ffffffffffffffb0;
  QObject **local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->i).d != (Data *)0x0) {
    begin((QHash<QObject_*,_QString> *)in_RDI);
    while( true ) {
      end((QHash<QObject_*,_QString> *)in_RDI);
      bVar2 = const_iterator::operator!=(in_RDI,(const_iterator *)in_stack_ffffffffffffffb0);
      if (!bVar2) break;
      const_iterator::value((const_iterator *)0x424fb3);
      bVar2 = ::operator==(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (bVar2) {
        local_30 = const_iterator::key((const_iterator *)0x424fd0);
        goto LAB_00424fee;
      }
      const_iterator::operator++(in_RSI);
    }
  }
  local_30 = (QObject **)0x0;
LAB_00424fee:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

const Key *keyImpl(const T &value) const noexcept
    {
        if (d) {
            const_iterator i = begin();
            while (i != end()) {
                if (i.value() == value)
                    return &i.key();
                ++i;
            }
        }

        return nullptr;
    }